

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall deqp::gles31::Functional::anon_unknown_0::SRGBTestCase::deinit(SRGBTestCase *this)

{
  code *pcVar1;
  SRGBTestTexture *this_00;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  data;
  int iVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  size_type sVar4;
  reference pvVar5;
  reference ppSVar6;
  size_type sVar7;
  reference ppSVar8;
  MovePtr *this_01;
  TypedObjectWrapper<(glu::ObjectType)3> *in_stack_ffffffffffffff58;
  SRGBTestSampler *this_02;
  undefined8 in_stack_ffffffffffffff60;
  size_type local_68;
  size_t samplerIdx;
  size_t textureSourceIdx;
  size_t renderBufferIdx;
  DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_> local_39;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  local_38;
  PtrData<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  *local_28;
  long local_18;
  Functions *gl;
  SRGBTestCase *this_local;
  
  gl = (Functions *)this;
  pRVar3 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  local_18 = CONCAT44(extraout_var,iVar2);
  de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>::DefaultDeleter(&local_39);
  this_01 = (MovePtr *)0x0;
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::MovePtr();
  local_28 = de::details::MovePtr::operator_cast_to_PtrData(&local_38,this_01);
  data._8_8_ = in_stack_ffffffffffffff60;
  data.ptr = in_stack_ffffffffffffff58;
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::operator=(&this->m_framebuffer,data);
  de::details::
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
  ::~MovePtr((MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
              *)&local_38);
  textureSourceIdx = 0;
  while( true ) {
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      (&this->m_renderBufferList);
    if (sVar4 <= textureSourceIdx) break;
    pcVar1 = *(code **)(local_18 + 0x460);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->m_renderBufferList,textureSourceIdx);
    (*pcVar1)(1,pvVar5);
    textureSourceIdx = textureSourceIdx + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_renderBufferList);
  samplerIdx = 0;
  while( true ) {
    sVar4 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
            ::size(&this->m_textureSourceList);
    if (sVar4 <= samplerIdx) break;
    ppSVar6 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
              ::operator[](&this->m_textureSourceList,samplerIdx);
    this_00 = *ppSVar6;
    if (this_00 != (SRGBTestTexture *)0x0) {
      SRGBTestTexture::~SRGBTestTexture(this_00);
      operator_delete(this_00,0xb8);
    }
    samplerIdx = samplerIdx + 1;
  }
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestTexture_*>_>
  ::clear(&this->m_textureSourceList);
  local_68 = 0;
  while( true ) {
    sVar4 = local_68;
    sVar7 = std::
            vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
            ::size(&this->m_samplerList);
    if (sVar7 <= sVar4) break;
    ppSVar8 = std::
              vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
              ::operator[](&this->m_samplerList,local_68);
    this_02 = *ppSVar8;
    if (this_02 != (SRGBTestSampler *)0x0) {
      SRGBTestSampler::~SRGBTestSampler(this_02);
      operator_delete(this_02,0x28);
    }
    local_68 = local_68 + 1;
  }
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::SRGBTestSampler_*>_>
  ::clear(&this->m_samplerList);
  if (this->m_vaoID != 0) {
    (**(code **)(local_18 + 0x490))(1,&this->m_vaoID);
    this->m_vaoID = 0;
  }
  if (this->m_vertexDataID != 0) {
    (**(code **)(local_18 + 0x438))(1,&this->m_vertexDataID);
    this->m_vertexDataID = 0;
  }
  return;
}

Assistant:

void SRGBTestCase::deinit (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_framebuffer	= de::MovePtr<glu::Framebuffer>(DE_NULL);

	for (std::size_t renderBufferIdx = 0; renderBufferIdx < m_renderBufferList.size(); renderBufferIdx++)
	{
		gl.deleteRenderbuffers(1, &m_renderBufferList[renderBufferIdx]);
	}
	m_renderBufferList.clear();

	for (std::size_t textureSourceIdx = 0; textureSourceIdx < m_textureSourceList.size(); textureSourceIdx++)
	{
		delete m_textureSourceList[textureSourceIdx];
	}
	m_textureSourceList.clear();

	for (std::size_t samplerIdx = 0; samplerIdx < m_samplerList.size(); samplerIdx++)
	{
		delete m_samplerList[samplerIdx];
	}
	m_samplerList.clear();

	if (m_vaoID != 0)
	{
		gl.deleteVertexArrays(1, &m_vaoID);
		m_vaoID = 0;
	}

	if (m_vertexDataID != 0)
	{
		gl.deleteBuffers(1, &m_vertexDataID);
		m_vertexDataID = 0;
	}
}